

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2256c::AV1QuantizeTest_QuantizeFpNoQmatrix_Test::TestBody
          (AV1QuantizeTest_QuantizeFpNoQmatrix_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar;
  int eob;
  tran_low_t dqcoeff_ptr [4];
  tran_low_t qcoeff_ptr [4];
  int16_t scan [4];
  tran_low_t ref_dqcoeff_ptr [4];
  tran_low_t ref_qcoeff_ptr [4];
  tran_low_t coeff_ptr [4];
  int coeff_count;
  int log_scale;
  int16_t quant_ptr [2];
  int16_t round_ptr [2];
  int16_t dequant_ptr [2];
  AssertHelper *this_00;
  int *lhs;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  int16_t *in_stack_ffffffffffffff00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffff08;
  int16_t *in_stack_ffffffffffffff10;
  tran_low_t *in_stack_ffffffffffffff20;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar2;
  Message *in_stack_ffffffffffffff38;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a0;
  int local_8c;
  int local_88 [4];
  AssertHelper local_78 [3];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x5d004e;
  local_10 = 0x2e0027;
  local_14 = 0x2c00348;
  local_18 = 0;
  local_1c = 4;
  local_38 = 0x270fffffe3f;
  local_30 = 0x18fffffff2;
  local_48 = 0x7fffffffa;
  local_40 = 0;
  local_58 = 0x28bfffffe2c;
  local_50 = 0;
  local_60 = 0x3000200010000;
  this_00 = local_78;
  lhs = local_88;
  local_8c = av1_quantize_fp_no_qmatrix
                       (in_stack_ffffffffffffff10,
                        (int16_t *)
                        in_stack_ffffffffffffff08._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                        (int16_t *)in_stack_fffffffffffffef0,
                        (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_ffffffffffffff20,
                        (tran_low_t *)
                        in_stack_ffffffffffffff28._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,
                        (tran_low_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
  ;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffee8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x324e90);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,(Type)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x324eed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x324f5b);
  for (iVar2 = 0; iVar2 < local_1c; iVar2 = iVar2 + 1) {
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,lhs,(int *)this_00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff20);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffee0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x324ff1);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,(Type)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x32503f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3250a4);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,lhs,(int *)this_00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff00);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffed8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x32511e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,(Type)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x32516c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3251ce);
  }
  return;
}

Assistant:

TEST(AV1QuantizeTest, QuantizeFpNoQmatrix) {
  // Here we use a uniform quantizer as an example
  const int16_t dequant_ptr[2] = { 78, 93 };  // quantize step
  const int16_t round_ptr[2] = { 39, 46 };    // round ~= dequant / 2

  // quant ~= 2^16 / dequant. This is a 16-bit fixed point representation of the
  // inverse of quantize step.
  const int16_t quant_ptr[2] = { 840, 704 };
  int log_scale = 0;
  int coeff_count = 4;
  const tran_low_t coeff_ptr[4] = { -449, 624, -14, 24 };
  const tran_low_t ref_qcoeff_ptr[4] = { -6, 7, 0, 0 };
  const tran_low_t ref_dqcoeff_ptr[4] = { -468, 651, 0, 0 };
  const int16_t scan[4] = { 0, 1, 2, 3 };
  tran_low_t qcoeff_ptr[4];
  tran_low_t dqcoeff_ptr[4];
  int eob = av1_quantize_fp_no_qmatrix(quant_ptr, dequant_ptr, round_ptr,
                                       log_scale, scan, coeff_count, coeff_ptr,
                                       qcoeff_ptr, dqcoeff_ptr);
  EXPECT_EQ(eob, 2);
  for (int i = 0; i < coeff_count; ++i) {
    EXPECT_EQ(qcoeff_ptr[i], ref_qcoeff_ptr[i]);
    EXPECT_EQ(dqcoeff_ptr[i], ref_dqcoeff_ptr[i]);
  }
}